

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

string * __thiscall QByteArray::toStdString_abi_cxx11_(QByteArray *this)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *__n;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  __s = data((QByteArray *)in_RDI);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            size((QByteArray *)in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,__s,(size_type)__n,in_RSI);
  std::allocator<char>::~allocator(&local_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string QByteArray::toStdString() const
{
    return std::string(data(), size_t(size()));
}